

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O2

string * __thiscall
flatbuffers::rust::RustGenerator::GenTableAccessorFuncBody
          (string *__return_storage_ptr__,RustGenerator *this,FieldDef *field,string *lifetime)

{
  char *__s;
  string local_180;
  string unwrap;
  string default_value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string typname;
  string vt_offset;
  
  IdlNamer::LegacyRustFieldOffsetName_abi_cxx11_(&vt_offset,&this->namer_,field);
  FollowType(&typname,this,&(field->value).type,lifetime);
  if (field->presence < kDefault) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&default_value,"None",(allocator<char> *)&unwrap);
  }
  else {
    GetDefaultValue_abi_cxx11_(&local_180,this,field,kAccessor);
    std::operator+(&unwrap,"Some(",&local_180);
    std::operator+(&default_value,&unwrap,")");
    std::__cxx11::string::~string((string *)&unwrap);
    std::__cxx11::string::~string((string *)&local_180);
  }
  __s = ".unwrap()";
  if (field->presence == kOptional) {
    __s = "";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&unwrap,__s,(allocator<char> *)&local_180);
  std::operator+(&local_120,"unsafe { self._tab.get::<",&typname);
  std::operator+(&local_100,&local_120,">({{STRUCT_TY}}::");
  std::operator+(&local_e0,&local_100,&vt_offset);
  std::operator+(&local_c0,&local_e0,", ");
  std::operator+(&local_a0,&local_c0,&default_value);
  std::operator+(&local_80,&local_a0,")");
  std::operator+(&local_180,&local_80,&unwrap);
  std::operator+(__return_storage_ptr__,&local_180,"}");
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&unwrap);
  std::__cxx11::string::~string((string *)&default_value);
  std::__cxx11::string::~string((string *)&typname);
  std::__cxx11::string::~string((string *)&vt_offset);
  return __return_storage_ptr__;
}

Assistant:

std::string GenTableAccessorFuncBody(const FieldDef &field,
                                       const std::string &lifetime) {
    const std::string vt_offset = namer_.LegacyRustFieldOffsetName(field);
    const std::string typname = FollowType(field.value.type, lifetime);
    // Default-y fields (scalars so far) are neither optional nor required.
    const std::string default_value =
        !(field.IsOptional() || field.IsRequired())
            ? "Some(" + GetDefaultValue(field, kAccessor) + ")"
            : "None";
    const std::string unwrap = field.IsOptional() ? "" : ".unwrap()";

    return "unsafe { self._tab.get::<" + typname +
           ">({{STRUCT_TY}}::" + vt_offset + ", " + default_value + ")" +
           unwrap + "}";
  }